

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddZddUtil.c
# Opt level: O0

int Cudd_zddPrintCover(DdManager *zdd,DdNode *node)

{
  int iVar1;
  int *list_00;
  int *list;
  int size;
  int i;
  DdNode *node_local;
  DdManager *zdd_local;
  
  iVar1 = zdd->sizeZ;
  if (iVar1 % 2 == 0) {
    list_00 = (int *)malloc((long)iVar1 << 2);
    if (list_00 == (int *)0x0) {
      zdd->errorCode = CUDD_MEMORY_OUT;
      zdd_local._4_4_ = 0;
    }
    else {
      for (list._4_4_ = 0; list._4_4_ < iVar1; list._4_4_ = list._4_4_ + 1) {
        list_00[list._4_4_] = 3;
      }
      zddPrintCoverAux(zdd,node,0,list_00);
      if (list_00 != (int *)0x0) {
        free(list_00);
      }
      zdd_local._4_4_ = 1;
    }
  }
  else {
    zdd_local._4_4_ = 0;
  }
  return zdd_local._4_4_;
}

Assistant:

int
Cudd_zddPrintCover(
  DdManager * zdd,
  DdNode * node)
{
    int         i, size;
    int         *list;

    size = (int)zdd->sizeZ;
    if (size % 2 != 0) return(0); /* number of variables should be even */
    list = ABC_ALLOC(int, size);
    if (list == NULL) {
        zdd->errorCode = CUDD_MEMORY_OUT;
        return(0);
    }
    for (i = 0; i < size; i++) list[i] = 3; /* bogus value should disappear */
    zddPrintCoverAux(zdd, node, 0, list);
    ABC_FREE(list);
    return(1);

}